

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easygetopt.c
# Opt level: O1

curl_easyoption * curl_easy_option_by_id(CURLoption id)

{
  curl_easyoption *pcVar1;
  curl_easyoption *o;
  curl_easyoption *pcVar2;
  
  if (id != 0) {
    pcVar2 = Curl_easyopts;
    do {
      if ((pcVar2->id == id) && ((pcVar2->flags & 1) == 0)) {
        return pcVar2;
      }
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (pcVar1->name != (char *)0x0);
  }
  return (curl_easyoption *)0x0;
}

Assistant:

const struct curl_easyoption *curl_easy_option_by_id(CURLoption id)
{
  return lookup(NULL, id);
}